

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O2

void Aig_ManSetPhase(Aig_Man_t *pAig)

{
  undefined1 *puVar1;
  void *pvVar2;
  int iVar3;
  
  puVar1 = &pAig->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 8;
  for (iVar3 = 0; iVar3 < pAig->vCis->nSize; iVar3 = iVar3 + 1) {
    pvVar2 = Vec_PtrEntry(pAig->vCis,iVar3);
    *(byte *)((long)pvVar2 + 0x18) = *(byte *)((long)pvVar2 + 0x18) & 0xf7;
  }
  for (iVar3 = 0; iVar3 < pAig->vObjs->nSize; iVar3 = iVar3 + 1) {
    pvVar2 = Vec_PtrEntry(pAig->vObjs,iVar3);
    if ((pvVar2 != (void *)0x0) && (0xfffffffd < ((uint)*(ulong *)((long)pvVar2 + 0x18) & 7) - 7)) {
      *(ulong *)((long)pvVar2 + 0x18) =
           (*(ulong *)((long)pvVar2 + 0x18) & 0xfffffffffffffff7) +
           (ulong)(((uint)*(ulong *)((long)pvVar2 + 0x10) ^
                   *(uint *)((*(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe) + 0x18) >> 3) &
                   ((uint)*(ulong *)((long)pvVar2 + 8) ^
                   *(uint *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x18) >> 3) & 1)
           * 8;
    }
  }
  for (iVar3 = 0; iVar3 < pAig->vCos->nSize; iVar3 = iVar3 + 1) {
    pvVar2 = Vec_PtrEntry(pAig->vCos,iVar3);
    *(ulong *)((long)pvVar2 + 0x18) =
         *(ulong *)((long)pvVar2 + 0x18) & 0xfffffffffffffff7 |
         (ulong)(((int)*(ulong *)((long)pvVar2 + 8) << 3 ^
                 *(uint *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x18)) & 8);
  }
  return;
}

Assistant:

void Aig_ManSetPhase( Aig_Man_t * pAig )
{
    Aig_Obj_t * pObj;
    int i;
    // set the PI simulation information
    Aig_ManConst1( pAig )->fPhase = 1;
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->fPhase = 0;
    // simulate internal nodes
    Aig_ManForEachNode( pAig, pObj, i )
        pObj->fPhase = ( Aig_ObjFanin0(pObj)->fPhase ^ Aig_ObjFaninC0(pObj) )
                     & ( Aig_ObjFanin1(pObj)->fPhase ^ Aig_ObjFaninC1(pObj) );
    // simulate PO nodes
    Aig_ManForEachCo( pAig, pObj, i )
        pObj->fPhase = Aig_ObjFanin0(pObj)->fPhase ^ Aig_ObjFaninC0(pObj);
}